

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_hashtable.cpp
# Opt level: O3

void __thiscall
duckdb::GroupedAggregateHashTable::~GroupedAggregateHashTable(GroupedAggregateHashTable *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pEVar1;
  _Head_base<0UL,_duckdb::PartitionedTupleData_*,_false> _Var2;
  
  (this->super_BaseAggregateHashTable)._vptr_BaseAggregateHashTable =
       (_func_int **)&PTR__GroupedAggregateHashTable_0243f0e0;
  Destroy(this);
  AggregateHTAppendState::~AggregateHTAppendState(&this->state);
  ::std::
  vector<duckdb::shared_ptr<duckdb::ArenaAllocator,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArenaAllocator,_true>_>_>
  ::~vector(&(this->stored_allocators).
             super_vector<duckdb::shared_ptr<duckdb::ArenaAllocator,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArenaAllocator,_true>_>_>
           );
  this_00 = (this->aggregate_allocator).internal.
            super___shared_ptr<duckdb::ArenaAllocator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  AllocatedData::~AllocatedData(&this->hash_map);
  pEVar1 = (this->predicates).
           super_vector<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>.
           super__Vector_base<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pEVar1 != (pointer)0x0) {
    operator_delete(pEVar1);
  }
  _Var2._M_head_impl =
       (this->unpartitioned_data).
       super_unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::PartitionedTupleData_*,_std::default_delete<duckdb::PartitionedTupleData>_>
       .super__Head_base<0UL,_duckdb::PartitionedTupleData_*,_false>._M_head_impl;
  if (_Var2._M_head_impl != (PartitionedTupleData *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_PartitionedTupleData + 8))();
  }
  (this->unpartitioned_data).
  super_unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::PartitionedTupleData_*,_std::default_delete<duckdb::PartitionedTupleData>_>
  .super__Head_base<0UL,_duckdb::PartitionedTupleData_*,_false>._M_head_impl =
       (PartitionedTupleData *)0x0;
  _Var2._M_head_impl =
       (this->partitioned_data).
       super_unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::PartitionedTupleData_*,_std::default_delete<duckdb::PartitionedTupleData>_>
       .super__Head_base<0UL,_duckdb::PartitionedTupleData_*,_false>._M_head_impl;
  if (_Var2._M_head_impl != (PartitionedTupleData *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_PartitionedTupleData + 8))();
  }
  (this->partitioned_data).
  super_unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::PartitionedTupleData_*,_std::default_delete<duckdb::PartitionedTupleData>_>
  .super__Head_base<0UL,_duckdb::PartitionedTupleData_*,_false>._M_head_impl =
       (PartitionedTupleData *)0x0;
  ::std::vector<duckdb::MatchFunction,_std::allocator<duckdb::MatchFunction>_>::~vector
            ((vector<duckdb::MatchFunction,_std::allocator<duckdb::MatchFunction>_> *)
             &this->row_matcher);
  BaseAggregateHashTable::~BaseAggregateHashTable(&this->super_BaseAggregateHashTable);
  return;
}

Assistant:

GroupedAggregateHashTable::~GroupedAggregateHashTable() {
	Destroy();
}